

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::writeAssertions(JunitReporter *this,SectionNode *sectionNode)

{
  bool bVar1;
  const_iterator __lhs;
  vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_> *in_RDI;
  const_iterator itEnd;
  const_iterator it;
  AssertionStats *in_stack_00000308;
  JunitReporter *in_stack_00000310;
  __normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (AssertionStats *)
       std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::begin(in_RDI);
  __lhs = std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
    ::operator*(local_18);
    writeAssertion(in_stack_00000310,in_stack_00000308);
    __gnu_cxx::
    __normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
    ::operator++(local_18);
  }
  return;
}

Assistant:

void writeAssertions( SectionNode const& sectionNode ) {
            for( SectionNode::Assertions::const_iterator
                    it = sectionNode.assertions.begin(), itEnd = sectionNode.assertions.end();
                    it != itEnd;
                    ++it )
                writeAssertion( *it );
        }